

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cost_sensitive.cc
# Opt level: O1

bool COST_SENSITIVE::example_is_test(example *ec)

{
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  wclass *pwVar4;
  ulong uVar5;
  
  pwVar4 = (ec->l).cs.costs._begin;
  lVar2 = (long)(ec->l).cs.costs._end - (long)pwVar4;
  if (lVar2 == 0) {
    return true;
  }
  uVar3 = lVar2 >> 4;
  if ((pwVar4->x != 3.4028235e+38) || (NAN(pwVar4->x))) {
    return false;
  }
  uVar1 = 1;
  while (uVar5 = uVar1, pwVar4 = pwVar4 + 1, uVar3 + (uVar3 == 0) != uVar5) {
    if ((pwVar4->x != 3.4028235e+38) || (uVar1 = uVar5 + 1, NAN(pwVar4->x))) break;
  }
  return uVar3 <= uVar5;
}

Assistant:

bool example_is_test(example& ec)
{
  v_array<COST_SENSITIVE::wclass> costs = ec.l.cs.costs;
  if (costs.size() == 0)
    return true;
  for (size_t j = 0; j < costs.size(); j++)
    if (costs[j].x != FLT_MAX)
      return false;
  return true;
}